

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fromClauseTermCanBeCoroutine(Parse *pParse,SrcList *pTabList,int i,int selFlags)

{
  u8 uVar1;
  int iEnd;
  CteUse *pCVar2;
  long lVar3;
  SrcItem *pSVar4;
  anon_struct_4_19_bb8b771d_for_fg *paVar5;
  uint uVar6;
  int iFirst;
  
  if ((pTabList->a[i].fg.field_0x2 & 2) != 0) {
    pCVar2 = pTabList->a[i].u2.pCteUse;
    uVar1 = pCVar2->eM10d;
    if (uVar1 == '\0') {
      return 0;
    }
    if ((uVar1 != '\x02') && (1 < pCVar2->nUse)) {
      return 0;
    }
  }
  uVar6 = 0;
  if (((pTabList->a[0].fg.jointype & 0x40) == 0) && ((pParse->db->dbOptFlags & 0x2000000) == 0)) {
    iFirst = i + 1;
    iEnd = pTabList->nSrc;
    pSVar4 = isSelfJoinView(pTabList,pTabList->a + i,iFirst,iEnd);
    if (pSVar4 == (SrcItem *)0x0) {
      if (i == 0) {
        uVar6 = 1;
        if ((iEnd != 1) && (((ulong)pTabList[1].a[0].pSTab & 2) == 0)) {
          uVar6 = (uint)(((uint)selFlags >> 0x1c & 1) == 0);
        }
      }
      else {
        uVar6 = 0;
        if (((uint)selFlags >> 0x1c & 1) == 0) {
          paVar5 = &pTabList->a[i].fg;
          do {
            if ((paVar5->jointype & 0x22) != 0) {
              return 0;
            }
            iFirst = iFirst + -1;
            if (iFirst == 0) {
              return 1;
            }
            lVar3 = (long)(paVar5 + -0x12);
            paVar5 = paVar5 + -0x12;
          } while ((*(byte *)(lVar3 + 1) & 4) == 0);
        }
      }
    }
  }
  return uVar6;
}

Assistant:

static int fromClauseTermCanBeCoroutine(
  Parse *pParse,          /* Parsing context */
  SrcList *pTabList,      /* FROM clause */
  int i,                  /* Which term of the FROM clause holds the subquery */
  int selFlags            /* Flags on the SELECT statement */
){
  SrcItem *pItem = &pTabList->a[i];
  if( pItem->fg.isCte ){
    const CteUse *pCteUse = pItem->u2.pCteUse;
    if( pCteUse->eM10d==M10d_Yes ) return 0;                          /* (2a) */
    if( pCteUse->nUse>=2 && pCteUse->eM10d!=M10d_No ) return 0;       /* (2b) */
  }
  if( pTabList->a[0].fg.jointype & JT_LTORJ ) return 0;               /* (3)  */
  if( OptimizationDisabled(pParse->db, SQLITE_Coroutines) ) return 0; /* (4)  */
  if( isSelfJoinView(pTabList, pItem, i+1, pTabList->nSrc)!=0 ){
    return 0;                                                          /* (5) */
  }
  if( i==0 ){
    if( pTabList->nSrc==1 ) return 1;                             /* (1a) */
    if( pTabList->a[1].fg.jointype & JT_CROSS ) return 1;         /* (1b) */
    if( selFlags & SF_UpdateFrom )              return 0;         /* (1c-iii) */
    return 1;
  }
  if( selFlags & SF_UpdateFrom ) return 0;                        /* (1c-iii) */
  while( 1 /*exit-by-break*/ ){
    if( pItem->fg.jointype & (JT_OUTER|JT_CROSS)  ) return 0;     /* (1c-ii) */
    if( i==0 ) break;
    i--;
    pItem--;
    if( pItem->fg.isSubquery ) return 0;                          /* (1c-i) */
  }
  return 1;
}